

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  void *in_RSI;
  secp256k1_fe *in_RDI;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe tmp;
  secp256k1_modinv64_modinfo *in_stack_00000078;
  secp256k1_modinv64_signed62 *in_stack_00000080;
  secp256k1_modinv64_signed62 local_60;
  secp256k1_fe local_38;
  secp256k1_fe *local_8;
  
  local_8 = in_RDI;
  memcpy(&local_38,in_RSI,0x28);
  secp256k1_fe_impl_normalize_var(&local_38);
  secp256k1_fe_to_signed62(&local_60,&local_38);
  secp256k1_modinv64_var(in_stack_00000080,in_stack_00000078);
  secp256k1_fe_from_signed62(local_8,&local_60);
  return;
}

Assistant:

static void secp256k1_fe_impl_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    secp256k1_fe tmp = *x;
    secp256k1_modinv64_signed62 s;

    secp256k1_fe_normalize_var(&tmp);
    secp256k1_fe_to_signed62(&s, &tmp);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_fe);
    secp256k1_fe_from_signed62(r, &s);
}